

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

Fl_Menu_Item * __thiscall Fl_Menu_::picked(Fl_Menu_ *this,Fl_Menu_Item *v)

{
  int iVar1;
  Fl_When FVar2;
  uint uVar3;
  Fl_Menu_Item *v_local;
  Fl_Menu_ *this_local;
  
  if (v != (Fl_Menu_Item *)0x0) {
    iVar1 = Fl_Menu_Item::radio(v);
    if (iVar1 == 0) {
      if ((v->flags & 2U) == 0) {
        if (v != this->value_) {
          Fl_Widget::set_changed(&this->super_Fl_Widget);
        }
      }
      else {
        Fl_Widget::set_changed(&this->super_Fl_Widget);
        v->flags = v->flags ^ 4;
        Fl_Widget::redraw(&this->super_Fl_Widget);
      }
    }
    else {
      iVar1 = Fl_Menu_Item::value(v);
      if (iVar1 == 0) {
        Fl_Widget::set_changed(&this->super_Fl_Widget);
        setonly(this,v);
      }
      Fl_Widget::redraw(&this->super_Fl_Widget);
    }
    this->value_ = v;
    FVar2 = Fl_Widget::when(&this->super_Fl_Widget);
    if (((FVar2 & (FL_WHEN_RELEASE|FL_WHEN_CHANGED)) != FL_WHEN_NEVER) &&
       ((uVar3 = Fl_Widget::changed(&this->super_Fl_Widget), uVar3 != 0 ||
        (FVar2 = Fl_Widget::when(&this->super_Fl_Widget),
        (FVar2 & FL_WHEN_NOT_CHANGED) != FL_WHEN_NEVER)))) {
      if ((this->value_ == (Fl_Menu_Item *)0x0) || (this->value_->callback_ == (Fl_Callback *)0x0))
      {
        Fl_Widget::do_callback(&this->super_Fl_Widget);
      }
      else {
        Fl_Menu_Item::do_callback(this->value_,&this->super_Fl_Widget);
      }
    }
  }
  return v;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_::picked(const Fl_Menu_Item* v) {
  if (v) {
    if (v->radio()) {
      if (!v->value()) { // they are turning on a radio item
        set_changed();
        setonly((Fl_Menu_Item*)v);
      }
      redraw();
    } else if (v->flags & FL_MENU_TOGGLE) {
      set_changed();
      ((Fl_Menu_Item*)v)->flags ^= FL_MENU_VALUE;
      redraw();
    } else if (v != value_) { // normal item
      set_changed();
    }
    value_ = v;
    if (when()&(FL_WHEN_CHANGED|FL_WHEN_RELEASE)) {
      if (changed() || when()&FL_WHEN_NOT_CHANGED) {
	if (value_ && value_->callback_) value_->do_callback((Fl_Widget*)this);
	else do_callback();
      }
    }
  }
  return v;
}